

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void duckdb_brotli::BrotliStoreMetaBlockTrivial
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  HistogramCommand *cmd_histo;
  HistogramDistance *dist_histo;
  HuffmanTree *tree;
  ulong uVar1;
  uint uVar2;
  HistogramLiteral *lit_histo;
  ulong uVar3;
  
  lit_histo = (HistogramLiteral *)BrotliAllocate(m,0x50a0);
  uVar2 = (params->dist).alphabet_size_max;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  switchD_0049f7f1::default(lit_histo,0,0x408);
  lit_histo->bit_cost_ = INFINITY;
  cmd_histo = (HistogramCommand *)(lit_histo + 1);
  switchD_0049f7f1::default(cmd_histo,0,0xb08);
  lit_histo[3].data_[0xba] = 0;
  lit_histo[3].data_[0xbb] = 0x7ff00000;
  dist_histo = (HistogramDistance *)(lit_histo[3].data_ + 0xbc);
  switchD_0049f7f1::default(dist_histo,0,0x888);
  lit_histo[5].data_[0xd6] = 0;
  lit_histo[5].data_[0xd7] = 0x7ff00000;
  BuildHistograms(input,start_pos,mask,commands,n_commands,lit_histo,cmd_histo,dist_histo);
  uVar1 = *storage_ix;
  uVar3 = uVar1 >> 3;
  *(ulong *)(storage + uVar3) = (ulong)storage[uVar3];
  *storage_ix = uVar1 + 0xd;
  tree = (HuffmanTree *)(lit_histo[9].data_ + 1);
  BuildAndStoreHuffmanTree
            ((uint32_t *)lit_histo,0x100,0x100,tree,(uint8_t *)(lit_histo[5].data_ + 0xd8),
             (uint16_t *)(lit_histo[6].data_ + 0x14),storage_ix,storage);
  BuildAndStoreHuffmanTree
            ((uint32_t *)cmd_histo,0x2c0,0x2c0,tree,(uint8_t *)(lit_histo[6].data_ + 0x94),
             (uint16_t *)(lit_histo[7].data_ + 0x40),storage_ix,storage);
  BuildAndStoreHuffmanTree
            ((uint32_t *)dist_histo,0x8c,(ulong)uVar2,tree,(uint8_t *)(lit_histo[8].data_ + 0x9c),
             (uint16_t *)(lit_histo[8].data_ + 0xbf),storage_ix,storage);
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_histo[5].data_ + 0xd8),
             (uint16_t *)(lit_histo[6].data_ + 0x14),(uint8_t *)(lit_histo[6].data_ + 0x94),
             (uint16_t *)(lit_histo[7].data_ + 0x40),(uint8_t *)(lit_histo[8].data_ + 0x9c),
             (uint16_t *)(lit_histo[8].data_ + 0xbf),storage_ix,storage);
  BrotliFree(m,lit_histo);
  if (is_last != 0) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlockTrivial(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  MetablockArena* arena = BROTLI_ALLOC(m, MetablockArena, 1);
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramClearLiteral(&arena->lit_histo);
  HistogramClearCommand(&arena->cmd_histo);
  HistogramClearDistance(&arena->dist_histo);

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &arena->lit_histo, &arena->cmd_histo, &arena->dist_histo);

  BrotliWriteBits(13, 0, storage_ix, storage);

  BuildAndStoreHuffmanTree(arena->lit_histo.data_, BROTLI_NUM_LITERAL_SYMBOLS,
                           BROTLI_NUM_LITERAL_SYMBOLS, arena->tree,
                           arena->lit_depth, arena->lit_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(arena->cmd_histo.data_, BROTLI_NUM_COMMAND_SYMBOLS,
                           BROTLI_NUM_COMMAND_SYMBOLS, arena->tree,
                           arena->cmd_depth, arena->cmd_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(arena->dist_histo.data_,
                           MAX_SIMPLE_DISTANCE_ALPHABET_SIZE,
                           num_distance_symbols, arena->tree,
                           arena->dist_depth, arena->dist_bits,
                           storage_ix, storage);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, arena->lit_depth, arena->lit_bits,
                            arena->cmd_depth, arena->cmd_bits,
                            arena->dist_depth, arena->dist_bits,
                            storage_ix, storage);
  BROTLI_FREE(m, arena);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}